

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O1

bool google::protobuf::util::FieldMaskUtil::TrimMessage
               (FieldMask *mask,Message *message,TrimOptions *options)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Descriptor *node;
  _Link_type node_00;
  Descriptor *descriptor;
  Message *message_00;
  _Link_type __x;
  undefined1 local_48 [8];
  FieldMaskTree tree;
  
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tree;
  tree.root_.children._M_t._M_impl._0_4_ = 0;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  anon_unknown_0::FieldMaskTree::MergeFromFieldMask((FieldMaskTree *)local_48,mask);
  if (*options == (TrimOptions)0x1) {
    iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
    node = protobuf::internal::CheckNotNull<google::protobuf::Descriptor_const>
                     ("/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/field_mask_util.cc"
                      ,0x2c9,"\'message->GetDescriptor()\' must not be nullptr",
                      (Descriptor *)CONCAT44(extraout_var,iVar2));
    if (tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0)
    {
      anon_unknown_0::FieldMaskTree::AddRequiredFieldPath
                ((FieldMaskTree *)local_48,(Node *)node,descriptor);
    }
  }
  __x = (_Link_type)0x2cb;
  node_00 = (_Link_type)
            protobuf::internal::CheckNotNull<google::protobuf::Message>
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/util/field_mask_util.cc"
                       ,0x2cb,"\'message\' must not be nullptr",message);
  if (tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = anon_unknown_0::FieldMaskTree::TrimMessage
                      ((FieldMaskTree *)local_48,(Node *)node_00,message_00);
    __x = node_00;
  }
  anon_unknown_0::FieldMaskTree::Node::ClearChildren((Node *)local_48);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node_*>_>_>
              *)tree.root_.children._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,__x);
  return bVar1;
}

Assistant:

bool FieldMaskUtil::TrimMessage(const FieldMask& mask, Message* message,
                                const TrimOptions& options) {
  // Build a FieldMaskTree and walk through the tree to merge all specified
  // fields.
  FieldMaskTree tree;
  tree.MergeFromFieldMask(mask);
  // If keep_required_fields is true, implicitely add required fields of
  // a message present in the tree to prevent from trimming.
  if (options.keep_required_fields()) {
    tree.AddRequiredFieldPath(GOOGLE_CHECK_NOTNULL(message->GetDescriptor()));
  }
  return tree.TrimMessage(GOOGLE_CHECK_NOTNULL(message));
}